

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  int iVar1;
  long lVar2;
  secp256k1_ge *psVar3;
  byte bVar4;
  int local_2c;
  
  bVar4 = 0;
  secp256k1_declassify(ctx,keypair->data + 0x20,0x40);
  iVar1 = secp256k1_pubkey_load(ctx,pk,(secp256k1_pubkey *)(keypair->data + 0x20));
  if (sk == (secp256k1_scalar *)0x0) {
    if (iVar1 != 0) {
      return 1;
    }
    psVar3 = &secp256k1_ge_const_g;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pk->x).n[0] = (psVar3->x).n[0];
      psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      pk = (secp256k1_ge *)((long)pk + (ulong)bVar4 * -0x10 + 8);
    }
  }
  else {
    if (iVar1 != 0) {
      local_2c = secp256k1_scalar_set_b32_seckey(sk,keypair->data);
      secp256k1_declassify(ctx,&local_2c,4);
      if (local_2c != 0) {
        return 1;
      }
      (*(ctx->illegal_callback).fn)("ret",(ctx->illegal_callback).data);
    }
    psVar3 = &secp256k1_ge_const_g;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pk->x).n[0] = (psVar3->x).n[0];
      psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      pk = (secp256k1_ge *)((long)pk + (ulong)bVar4 * -0x10 + 8);
    }
    *sk = 1;
  }
  return 0;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}